

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O0

size_t mfread(void *ptr,size_t size,size_t nmemb,mFILE *mf)

{
  ulong uVar1;
  ulong local_48;
  char *cptr;
  size_t len;
  mFILE *mf_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  if (mf == m_channel[0]) {
    init_mstdin();
  }
  if (mf->offset < mf->size) {
    uVar1 = mf->size - mf->offset;
    if (size * nmemb < uVar1 || size * nmemb - uVar1 == 0) {
      local_48 = size * nmemb;
    }
    else {
      local_48 = mf->size - mf->offset;
    }
    if (size == 0) {
      ptr_local = (void *)0x0;
    }
    else {
      memcpy(ptr,mf->data + mf->offset,local_48);
      mf->offset = local_48 + mf->offset;
      if (local_48 != size * nmemb) {
        mf->eof = 1;
      }
      ptr_local = (void *)(local_48 / size);
    }
  }
  else {
    ptr_local = (void *)0x0;
  }
  return (size_t)ptr_local;
}

Assistant:

size_t mfread(void *ptr, size_t size, size_t nmemb, mFILE *mf) {
    size_t len;
    char *cptr = (char *)ptr;
    
    if (mf == m_channel[0]) init_mstdin();

    if (mf->size <= mf->offset)
	return 0;

    len = size * nmemb <= mf->size - mf->offset
	? size * nmemb
	: mf->size - mf->offset;
    if (!size)
	return 0;

    memcpy(cptr, &mf->data[mf->offset], len);
    mf->offset += len;
    
    if (len != size * nmemb) {
	mf->eof = 1;
    }

    return len / size;
}